

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void reset_slot(EOPLL_SLOT *slot,int number)

{
  int number_local;
  EOPLL_SLOT *slot_local;
  
  slot->number = (uint8_t)number;
  slot->type = (uint8_t)(number % 2);
  slot->pg_keep = '\0';
  slot->wave_table = wave_table_map[0];
  slot->pg_phase = 0;
  slot->output[0] = 0;
  slot->output[1] = 0;
  slot->eg_state = '\x03';
  slot->eg_shift = 0;
  slot->rks = '\0';
  slot->tll = 0;
  slot->key_flag = '\0';
  slot->sus_flag = '\0';
  slot->blk_fnum = 0;
  slot->blk = '\0';
  slot->fnum = 0;
  slot->volume = 0;
  slot->pg_out = 0;
  slot->eg_out = 0x7f;
  slot->patch = &null_patch;
  return;
}

Assistant:

static void reset_slot(EOPLL_SLOT *slot, int number) {
  slot->number = number;
  slot->type = number % 2;
  slot->pg_keep = 0;
  slot->wave_table = wave_table_map[0];
  slot->pg_phase = 0;
  slot->output[0] = 0;
  slot->output[1] = 0;
  slot->eg_state = RELEASE;
  slot->eg_shift = 0;
  slot->rks = 0;
  slot->tll = 0;
  slot->key_flag = 0;
  slot->sus_flag = 0;
  slot->blk_fnum = 0;
  slot->blk = 0;
  slot->fnum = 0;
  slot->volume = 0;
  slot->pg_out = 0;
  slot->eg_out = EG_MUTE;
  slot->patch = &null_patch;
}